

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::InsertOrReplaceNode
          (KeyMapBase<unsigned_long> *this,KeyNode *node)

{
  NodeBase **ppNVar1;
  bool bVar2;
  NodeBase *node_00;
  uintptr_t v;
  map_index_t b;
  ulong uVar3;
  long lVar4;
  NodeAndBucket NVar5;
  
  NVar5 = FindHelper(this,(ViewType_conflict1)node[1].super_NodeBase.next);
  node_00 = NVar5.node;
  b = NVar5.bucket;
  if (node_00 == (NodeBase *)0x0) {
    bVar2 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar2) {
      uVar3 = ((ulong)node[1].super_NodeBase.next ^
              (ulong)&absl::lts_20250127::hash_internal::MixingHashState::kSeed) *
              -0x234dd359734ecb13;
      ppNVar1 = (this->super_UntypedMapBase).table_;
      uVar3 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
               uVar3 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
      lVar4 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
               uVar3 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
      b = ((uint)(byte)((ulong)lVar4 >> 0x38) | ((uint)((ulong)lVar4 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar4 >> 0x18) & 0xff0000 | (uint)((ulong)lVar4 >> 8) & 0xff000000) &
          (this->super_UntypedMapBase).num_buckets_ - 1;
    }
  }
  else {
    EraseImpl(this,b,(KeyNode *)node_00,true);
  }
  InsertUnique(this,b,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return node_00 == (NodeBase *)0x0;
}

Assistant:

bool InsertOrReplaceNode(KeyNode* node) {
    bool is_new = true;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (ABSL_PREDICT_FALSE(p.node != nullptr)) {
      EraseImpl(p.bucket, static_cast<KeyNode*>(p.node), true);
      is_new = false;
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return is_new;
  }